

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  JSValue val;
  int iVar2;
  JSValueUnion JVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  JSValueUnion JVar7;
  JSValue *argv_00;
  JSRefCountHeader *p;
  JSValue JVar8;
  JSValue JVar9;
  JSValue prop;
  int final;
  int start;
  undefined4 in_stack_ffffffffffffff74;
  int local_74;
  ulong local_70;
  uint local_68;
  uint local_64;
  ulong local_60;
  JSValueUnion local_58;
  int64_t local_50;
  ulong local_48;
  undefined8 local_40;
  
  JVar7 = this_val.u;
  local_74 = js_typed_array_get_length_internal(ctx,this_val);
  if (local_74 < 0) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  argv_00 = (JSValue *)0x0;
  iVar2 = JS_ToInt32Clamp(ctx,(int *)&local_64,*argv,0,local_74,local_74);
  if (iVar2 != 0) goto LAB_0016b7d2;
  if ((int)argv[1].tag != 3) {
    argv_00 = (JSValue *)0x0;
    JVar8.tag = argv[1].tag;
    JVar8.u.ptr = argv[1].u.ptr;
    iVar2 = JS_ToInt32Clamp(ctx,&local_74,JVar8,0,local_74,local_74);
    if (iVar2 != 0) goto LAB_0016b7d2;
  }
  local_70 = (ulong)local_64;
  uVar5 = local_74 - local_64;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  if (((int)this_val.tag != -1) || (8 < (ushort)(*(ushort *)((long)JVar7.ptr + 6) - 0x15))) {
    JS_ThrowTypeError(ctx,"not a %s","TypedArray");
    goto LAB_0016b7d2;
  }
  local_68 = (uint)(byte)"includes"[(ulong)*(ushort *)((long)JVar7.ptr + 6) + 1];
  local_48 = (ulong)uVar4;
  local_40 = 0;
  JVar9.tag = (int64_t)&local_58;
  JVar9.u.float64 = 9.88131291682493e-324;
  local_58 = JVar7;
  local_50 = this_val.tag;
  JVar8 = js_typed_array___speciesCreate(ctx,JVar9,0x178f8a,argv_00);
  JVar3 = JVar8.u;
  uVar6 = JVar8.tag & 0xffffffff;
  if (uVar6 != 6) {
    if ((int)uVar5 < 1) {
      return JVar8;
    }
    local_60 = uVar6;
    iVar2 = validate_typed_array(ctx,this_val);
    if ((iVar2 == 0) && (iVar2 = validate_typed_array(ctx,JVar8), iVar2 == 0)) {
      if ((int)local_60 == -1) {
        uVar1 = *(ushort *)((long)JVar3.ptr + 6);
        if (8 < (ushort)(uVar1 - 0x15)) goto LAB_0016b85a;
        if (((*(ushort *)((long)JVar7.ptr + 6) == uVar1) &&
            (uVar4 <= *(uint *)(*(long *)((long)JVar3.ptr + 0x30) + 0x24) >>
                      ("includes"[(ulong)uVar1 + 1] & 0x1fU))) &&
           ((int)local_70 + uVar4 <=
            *(uint *)(*(long *)((long)JVar7.ptr + 0x30) + 0x24) >>
            ("includes"[(ulong)uVar1 + 1] & 0x1fU))) {
          memcpy(*(void **)((long)JVar3.ptr + 0x38),
                 (void *)((long)((int)local_70 << ((byte)local_68 & 0x1f)) +
                         *(long *)((long)JVar7.ptr + 0x38)),
                 (long)(int)(uVar4 << ((byte)local_68 & 0x1f)));
          return JVar8;
        }
      }
      else {
LAB_0016b85a:
        JS_ThrowTypeError(ctx,"not a %s","TypedArray");
      }
      uVar6 = 0;
      while( true ) {
        JVar9 = JS_GetPropertyValue(ctx,this_val,
                                    (JSValue)ZEXT416((uint)((int)local_70 + (int)uVar6)));
        if (((int)JVar9.tag == 6) ||
           (val.tag._0_4_ = 0x4000, val.u = (JSValueUnion)JVar9.tag,
           val.tag._4_4_ = in_stack_ffffffffffffff74, prop.tag = 0, prop.u = (JSValueUnion)uVar6,
           iVar2 = JS_SetPropertyValue(ctx,JVar8,prop,val,JVar9.u._0_4_), iVar2 < 0)) break;
        uVar6 = uVar6 + 1;
        if (uVar5 == uVar6) {
          return JVar8;
        }
      }
    }
  }
  if ((0xfffffff4 < (uint)JVar8.tag) &&
     (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
LAB_0016b7d2:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_typed_array_slice(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst args[2];
    JSValue arr, val;
    JSObject *p, *p1;
    int n, len, start, final, count, shift;

    arr = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;
    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);

    p = get_typed_array(ctx, this_val, 0);
    if (p == NULL)
        goto exception;
    shift = typed_array_size_log2(p->class_id);

    args[0] = this_val;
    args[1] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
    if (JS_IsException(arr))
        goto exception;

    if (count > 0) {
        if (validate_typed_array(ctx, this_val)
        ||  validate_typed_array(ctx, arr))
            goto exception;

        p1 = get_typed_array(ctx, arr, 0);
        if (p1 != NULL && p->class_id == p1->class_id &&
            typed_array_get_length(ctx, p1) >= count &&
            typed_array_get_length(ctx, p) >= start + count) {
            memcpy(p1->u.array.u.uint8_ptr,
                   p->u.array.u.uint8_ptr + (start << shift),
                   count << shift);
        } else {
            for (n = 0; n < count; n++) {
                val = JS_GetPropertyValue(ctx, this_val, JS_NewInt32(ctx, start + n));
                if (JS_IsException(val))
                    goto exception;
                if (JS_SetPropertyValue(ctx, arr, JS_NewInt32(ctx, n), val,
                                        JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
    }
    return arr;

 exception:
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}